

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::anon_unknown_1::GridRenderCase::init
          (GridRenderCase *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *this_00;
  int iVar1;
  long lVar2;
  char *pcVar3;
  EVP_PKEY_CTX *ctx_00;
  bool bVar4;
  undefined1 local_190 [120];
  ios_base local_118 [264];
  
  local_190._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_00 = (ostringstream *)(local_190 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"Rendering yellow-green grid to ",0x1f);
  bVar4 = this->m_flags == 0;
  pcVar3 = "fbo";
  if (bVar4) {
    pcVar3 = "default frame buffer";
  }
  lVar2 = 3;
  if (bVar4) {
    lVar2 = 0x14;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar3,lVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,
             "Grid cells are in random order, varying grid size and location for each iteration.\n",
             0x53);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,
             "Marking all discardable fragments (fragments outside the bounding box) with a fully saturated blue channel."
             ,0x6b);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
  ctx_00 = (EVP_PKEY_CTX *)&std::__cxx11::ostringstream::VTT;
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_118);
  iVar1 = BBoxRenderCase::init((BBoxRenderCase *)this,ctx_00);
  return iVar1;
}

Assistant:

void GridRenderCase::init (void)
{
	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Rendering yellow-green grid to " << ((m_renderTarget == RENDERTARGET_DEFAULT) ? ("default frame buffer") : ("fbo")) << ".\n"
		<< "Grid cells are in random order, varying grid size and location for each iteration.\n"
		<< "Marking all discardable fragments (fragments outside the bounding box) with a fully saturated blue channel."
		<< tcu::TestLog::EndMessage;

	BBoxRenderCase::init();
}